

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_linalg.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  ostream *poVar14;
  Scalar *pSVar15;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar16;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *pCVar17;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *pCVar18;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar19;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Scalar SVar20;
  Scalar SVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  PVar32;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>
  PVar33;
  ChMatrixDynamic<> Md2;
  ChMatrixDynamic<> M2;
  ChMatrixDynamic<> M3;
  ChMatrixDynamic<> M1;
  ChMatrixDynamic<> Md1;
  ChVector<double> vl1;
  ChMatrixNM<double,_4,_4> Ms;
  ChMatrixDynamic<> D;
  ChMatrixDynamic<double> CD;
  ChQuaternion<double> q2;
  ChVector<double> v_1;
  ChMatrixDynamic<double> CD_t;
  ChVector<double> vl4;
  DenseStorage<double,__1,__1,__1,_1> local_580;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  DenseStorage<double,__1,__1,__1,_1> local_520 [4];
  DenseStorage<double,__1,__1,__1,_1> local_4c0 [4];
  Matrix<double,_3,_3,_1,_3,_3> local_460;
  Matrix<double,_3,_3,_1,_3,_3> local_400;
  ulong uStack_3b8;
  undefined8 uStack_3b0;
  ulong uStack_3a8;
  undefined8 uStack_3a0;
  ulong uStack_398;
  ulong uStack_390;
  undefined8 uStack_388;
  double local_370;
  Scalar local_368;
  ChQuaternion<double> local_360;
  ChMatrix33<double> local_340 [4];
  ChVector<double> local_200 [4];
  ChVector<double> local_1a0 [4];
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_130;
  ChQuaternion<double> local_128;
  ChVector<double> local_108;
  ChVector<double> local_f0 [3];
  ChVector<double> local_a8;
  undefined1 local_90 [16];
  double local_80;
  
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Creation and assignment ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_580.m_data._0_4_ = 7;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 5;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_400,(int *)local_340,(int *)&local_580);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 4;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
  _0_4_ = 4;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_580,(int *)local_340,(int *)&local_460);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_340,(Scalar *)&local_460);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_400);
  Eigen::internal::
  inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run
            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_400);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_400,2,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_400);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false>::run
            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_580);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       3.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_580,(Scalar *)&local_460
            );
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_580,0,
                       0);
  *pSVar15 = 10.0;
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_580,0,
                       0);
  local_368 = *pSVar15;
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_580,1,
                       1);
  local_370 = *pSVar15;
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_580,1,
                       2);
  *pSVar15 = local_370 + local_368;
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_580,2,
                       2);
  *pSVar15 = 4.0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&local_460,&local_580);
  local_4c0[0].m_data = (double *)local_340;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,4,4,1,4,4>const>>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_520,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
              *)local_4c0);
  local_200[0].m_data[0] = (double)CONCAT44(local_200[0].m_data[0]._4_4_,8);
  local_1a0[0].m_data[0] = (double)CONCAT44(local_1a0[0].m_data[0]._4_4_,4);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_4c0,(int *)local_200,(int *)local_1a0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_4c0,
             (Matrix<double,__1,__1,_1,__1,__1> *)&local_460);
  local_200[0].m_data[0] = (double)&local_460;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_4c0,
             (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_200);
  Eigen::internal::handmade_aligned_free(local_4c0[0].m_data);
  Eigen::internal::handmade_aligned_free(local_520[0].m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0]);
  Eigen::internal::handmade_aligned_free(local_580.m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0]);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Matrix operations ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_580.m_data._0_4_ = 3;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 2;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_460,(int *)local_340,(int *)&local_580);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,3,1,2,3>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_520,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,3,1,2,3>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,2,3,1,2,3>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (Matrix<double,_2,_3,_1,_2,_3> *)&local_400);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_520,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,3,1,2,3>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)local_340);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,2,3,1,2,3>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (Matrix<double,_2,_3,_1,_2,_3> *)&local_400);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_520,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_460);
  local_580.m_data._0_4_ = 10;
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>_>
              *)local_340,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (int *)&local_580);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,2,3,1,2,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,3,1,2,3>const>const>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>_>
              *)local_340);
  local_580.m_data._0_4_ = 10;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>
                    *)local_340,(int *)&local_580,(StorageBaseType *)&local_400);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,3,1,2,3>const>const,Eigen::Matrix<double,2,3,1,2,3>const>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>
              *)local_340);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_520);
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,2,3,1,2,3>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_520,
             (Matrix<double,_2,_3,_1,_2,_3> *)&local_400);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
       0x40240000;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_520,(Scalar *)local_340);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_520);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_580.m_data._0_4_ = 2;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_4c0,(int *)local_340,(int *)&local_580);
  local_580.m_data._0_4_ = 3;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 2;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_200,(int *)local_340,(int *)&local_580);
  PVar32 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_4c0,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_200);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
       PVar32.m_lhs._0_4_;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
       PVar32.m_lhs._4_4_;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)PVar32.m_rhs;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_1a0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
              *)local_340);
  local_580.m_data = (double *)local_200;
  local_360.m_data[0] = (double)local_4c0;
  PVar33 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                     ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                      &local_580,
                      (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)
                      &local_360);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
       PVar33.m_lhs.m_matrix._0_4_;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
       PVar33.m_lhs.m_matrix._4_4_;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)PVar33.m_rhs.m_matrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_f0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
              *)local_340);
  chrono::Q_from_AngX(1.0471975511965976);
  chrono::ChMatrix33<double>::Set_A_quaternion(local_340,(ChQuaternion<double> *)&local_580);
  poVar14 = std::operator<<((ostream *)&std::cout,"rot * matrix\n");
  local_580._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_340,
                  (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_4c0);
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                                       *)&local_580);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"matrix * rot\n");
  local_580._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_200,
                  (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_340);
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                                       *)&local_580);
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::internal::handmade_aligned_free((void *)local_f0[0].m_data[0]);
  Eigen::internal::handmade_aligned_free((void *)local_1a0[0].m_data[0]);
  Eigen::internal::handmade_aligned_free((void *)local_200[0].m_data[0]);
  Eigen::internal::handmade_aligned_free(local_4c0[0].m_data);
  Eigen::internal::handmade_aligned_free(local_520[0].m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0]);
  poVar14 = std::operator<<((ostream *)&std::cout,
                            "\n=== Chrono extensions to Eigen::MatrixBase ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400);
  poVar14 = std::operator<<((ostream *)&std::cout,"random 2x3 matrix A:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::fillDiagonal
            ((MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400,10.1);
  poVar14 = std::operator<<((ostream *)&std::cout,"fill diagonal with 10.1:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ =
       0xcccccccd;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
       0x4000cccc;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400,(Scalar *)local_340);
  poVar14 = std::operator<<((ostream *)&std::cout,"fill entire matrix with 2.1:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  dStack_560 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
  local_580.m_cols =
       (Index)local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[2];
  dStack_568 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
  dStack_558 = local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5] + 0.01;
  poVar14 = std::operator<<((ostream *)&std::cout,"matrix B = A with B(1,2) incremented by 0.01\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_580
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"|A-B| < 0.1?   ");
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::equals<Eigen::Matrix<double,2,3,1,2,3>>
            ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_580,0.1);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"|A-B| < 0.001? ");
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::equals<Eigen::Matrix<double,2,3,1,2,3>>
            ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)&local_400,
             (MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_580,0.001);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  std::endl<char,std::char_traits<char>>(poVar14);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_520,(int *)local_340);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       2.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_520,(Scalar *)&local_460);
  local_4c0[0].m_data = (double *)0x4008000000000000;
  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340,
                       (Scalar *)local_4c0);
  local_200[0].m_data[0] = 4.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar16,local_200[0].m_data);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_4c0,(int *)local_340);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_4c0,(Scalar *)&local_460);
  local_200[0].m_data[0] = 0.2;
  pCVar16 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340,
                       local_200[0].m_data);
  local_1a0[0].m_data[0] = 0.3;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar16,local_1a0[0].m_data);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_340);
  std::operator<<((ostream *)&std::cout,"||v||_wrms, w = ");
  SVar20 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
           wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                     ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_520,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4c0,(type *)0x0);
  poVar14 = std::ostream::_M_insert<double>(SVar20);
  std::endl<char,std::char_traits<char>>(poVar14);
  std::operator<<((ostream *)&std::cout,"||v + v||_wrms, w = ");
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_340,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_520,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_520);
  SVar21 = Eigen::
           MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
           ::wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                     ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       *)local_340,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4c0,
                      (type *)0x0);
  poVar14 = std::ostream::_M_insert<double>(SVar21);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"v + v + 1: ");
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_460,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_520,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_520);
  local_200[0].m_data[0] = 1.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)local_340,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_460,local_200[0].m_data);
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                       *)local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"1 + v: ");
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  Eigen::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_340,(Scalar *)&local_460,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_520);
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::internal::handmade_aligned_free(local_4c0[0].m_data);
  Eigen::internal::handmade_aligned_free(local_520[0].m_data);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Matrix comparison tests ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_340);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<Eigen::Matrix<double,2,3,1,2,3>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_400,(Matrix<double,_2,_3,_1,_2,_3> *)local_340);
  bVar13 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator==
                     ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_340,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_400);
  if (bVar13) {
    poVar14 = std::operator<<((ostream *)&std::cout,"Matrices are exactly equal");
    std::endl<char,std::char_traits<char>>(poVar14);
  }
  pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_400,1,
                       2);
  *pSVar15 = *pSVar15 + 0.001;
  bVar13 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::
           equals<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                     ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_340,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_400,0.002);
  if (bVar13) {
    std::operator<<((ostream *)&std::cout,"Matrices are equal within tol 0.002 \n");
  }
  Eigen::internal::handmade_aligned_free
            ((void *)local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0]);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Pasting matrices and matrix-blocks ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[0]._4_4_,6);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 4;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)local_520,(int *)local_340,(int *)&local_400);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_520);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_520);
  std::operator<<(poVar14,"\n\n");
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_580.m_data = (double *)0x4000000000000000;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_400;
  pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_340,
                       (Scalar *)&local_580);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       3.0;
  pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                      (pCVar17,(Scalar *)&local_460);
  local_4c0[0].m_data = (double *)0x4010000000000000;
  pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                      (pCVar17,(Scalar *)local_4c0);
  local_200[0].m_data[0] = 5.0;
  pCVar17 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                      (pCVar17,local_200[0].m_data);
  local_1a0[0].m_data[0] = 6.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
            (pCVar17,local_1a0[0].m_data);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_340);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_400);
  std::operator<<(poVar14,"\n\n");
  Eigen::DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_340);
  pdVar1 = (double *)
           ((long)local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 0x40);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_580;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 10.0;
  dStack_568 = 4.94065645841247e-324;
  dStack_560 = 4.94065645841247e-324;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  dStack_558 = 3.45845952088873e-323;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_4c0[0].m_data = (double *)0x4034000000000000;
  local_580.m_cols = (Index)local_340;
  local_580.m_data = pdVar1;
  pCVar18 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                       *)&local_460,(Scalar *)local_4c0);
  local_200[0].m_data[0] = 30.0;
  pCVar18 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar18,local_200[0].m_data);
  local_1a0[0].m_data[0] = 40.0;
  pCVar18 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar18,local_1a0[0].m_data);
  local_f0[0].m_data[0] = 50.0;
  pCVar18 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar18,local_f0[0].m_data);
  local_360.m_data[0] = 60.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
  operator_(pCVar18,local_360.m_data);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
  finished((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *)
           &local_460);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_340);
  std::operator<<(poVar14,"\n\n");
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage(local_4c0,local_520);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2,_3,_false> *)&local_580,
             (Matrix<double,__1,__1,_1,__1,__1> *)local_4c0,1,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,2,3,false>,Eigen::Matrix<double,2,3,1,2,3>>
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2,_3,_false> *)&local_580,
             (Matrix<double,_2,_3,_1,_2,_3> *)&local_400);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_4c0);
  std::operator<<(poVar14,"\n\n");
  dStack_568 = 4.94065645841247e-324;
  dStack_560 = 4.94065645841247e-324;
  dStack_558 = 3.45845952088873e-323;
  local_580.m_cols = (Index)local_340;
  local_580.m_data = pdVar1;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2,_3,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_2,_3,_false> *)&local_460,
             (Matrix<double,__1,__1,_1,__1,__1> *)local_4c0,1,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,2,3,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,2,3,false>> *)&local_460,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *)
             &local_580);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_4c0);
  std::operator<<(poVar14,"\n\n");
  Eigen::internal::handmade_aligned_free(local_4c0[0].m_data);
  Eigen::internal::handmade_aligned_free(local_520[0].m_data);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== 3x3 matrix times vector ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_580.m_data = (double *)0x3ff0000000000000;
  local_580.m_rows = 0x4000000000000000;
  local_580.m_cols = 0x4008000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_340);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_400,1.0);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_400);
  std::endl<char,std::char_traits<char>>(poVar14);
  auVar11._8_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar11._0_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar10._8_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar10._0_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar12._8_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar12._0_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar4 = vmovhpd_avx(auVar11,local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[4]);
  auVar5 = vmovhpd_avx(auVar10,local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3]);
  auVar6 = vmovhpd_avx(auVar12,local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5]);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] +
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] +
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar7 = vfmadd132sd_fma(auVar30,auVar28,ZEXT816(0x4008000000000000));
  auVar22._0_8_ = auVar5._0_8_ + auVar4._0_8_ + auVar4._0_8_;
  auVar22._8_8_ = auVar5._8_8_ + auVar4._8_8_ + auVar4._8_8_;
  auVar8._8_8_ = 0x4008000000000000;
  auVar8._0_8_ = 0x4008000000000000;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
  _0_16_ = vfmadd132pd_avx512vl(auVar6,auVar22,auVar8);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar7._0_8_;
  local_4c0[0].m_data = (double *)local_340;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_4c0,
                    (ChVector<double> *)&local_580);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = chrono::operator<<((ostream *)&std::cout,(ChVector<double> *)&local_460);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = chrono::operator<<((ostream *)&std::cout,(ChVector<double> *)local_520);
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Ones((ConstantReturnType *)local_340,3,4)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>> *)&local_580,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)local_340);
  local_360.m_data[0] = 1.0;
  local_360.m_data[1] = 2.0;
  local_360.m_data[2] = 3.0;
  local_360.m_data[3] = 4.0;
  chrono::operator*((ChMatrix34<double> *)&local_580,&local_360);
  poVar14 = chrono::operator<<((ostream *)&std::cout,&local_108);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_520[0].m_data._0_4_ = 2;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_580;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>_>
                    *)local_340,(int *)local_520,(StorageBaseType *)&local_400);
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,3,0,4,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *)&local_460,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>_>_>
              *)local_340);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)&local_460);
  std::endl<char,std::char_traits<char>>(poVar14);
  chrono::operator*((ChMatrix43<double> *)&local_460,&local_108);
  local_360.m_data[0] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_360.m_data[1] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_360.m_data[2] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_360.m_data[3] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  poVar14 = chrono::operator<<((ostream *)&std::cout,&local_360);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_580;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)&local_400,&local_108);
  local_360.m_data[0] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_360.m_data[1] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_360.m_data[2] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_360.m_data[3] =
       local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  poVar14 = chrono::operator<<((ostream *)&std::cout,&local_360);
  std::endl<char,std::char_traits<char>>(poVar14);
  chrono::Q_from_AngX(0.5235987755982988);
  chrono::ChMatrix33<double>::Set_A_quaternion
            ((ChMatrix33<double> *)local_f0,(ChQuaternion<double> *)local_340);
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_f0);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_f0;
  poVar14 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *
                              )local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_580;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_f0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,4,1,3,4>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>> *)local_520,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>_>
              *)local_340);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_460;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_f0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,4,3,0,4,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,4,1,3,4>> *)local_4c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_0>_>
              *)local_340);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_f0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_460;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *)local_200,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_340);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_f0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_580;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,3,0,4,3>> *)local_1a0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_340);
  poVar14 = std::operator<<((ostream *)&std::cout,"rot * G:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_520)
  ;
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"rot * (G\').transpose:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_4c0)
  ;
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"G\' * rot:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_200)
  ;
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"G.transpose * rot:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_1a0)
  ;
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_340);
  chrono::operator*((ChMatrix44<double> *)local_340,&local_360);
  poVar14 = std::operator<<((ostream *)&std::cout,"Random 4x4 * q:\n");
  poVar14 = chrono::operator<<(poVar14,&local_128);
  std::endl<char,std::char_traits<char>>(poVar14);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       -2.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       -3.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       -4.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       2.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       1.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -4.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       3.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       3.0;
  uStack_3b8 = 0x4010000000000000;
  uStack_3b0 = 0x3ff0000000000000;
  uStack_3a8 = 0xc000000000000000;
  uStack_3a0 = 0x4010000000000000;
  uStack_398 = 0xc008000000000000;
  uStack_390 = 0x4000000000000000;
  uStack_388 = 0x3ff0000000000000;
  poVar14 = std::operator<<((ostream *)&std::cout,"4x4 star matrix X:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6];
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       -local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar24._0_8_ = uStack_3b8 ^ 0x8000000000000000;
  auVar24._8_4_ = 0;
  auVar24._12_4_ = 0x80000000;
  auVar26._0_8_ = uStack_3a8 ^ 0x8000000000000000;
  auVar26._8_4_ = 0;
  auVar26._12_4_ = 0x80000000;
  uStack_3b8 = vmovlps_avx(auVar24);
  uStack_3a8 = vmovlps_avx(auVar26);
  uStack_398 = uStack_398 ^ 0x8000000000000000;
  uStack_390 = uStack_390 ^ 0x8000000000000000;
  poVar14 = std::operator<<((ostream *)&std::cout,"Semi-transpose X:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  chrono::ChStarMatrix44<double>::semiNegate((ChStarMatrix44<double> *)&local_400);
  poVar14 = std::operator<<((ostream *)&std::cout,"Semi-negate X:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Use of ChTransform ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       2.0;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       3.0;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       4.0;
  local_520[0].m_rows = 0x4018000000000000;
  local_520[0].m_data = (double *)0x4014000000000000;
  local_520[0].m_cols = 0x401c000000000000;
  local_580.m_data = (double *)0x3ff0000000000000;
  local_580.m_rows = 0x4008000000000000;
  local_580.m_cols = 0x4010000000000000;
  dStack_568 = 5.0;
  chrono::ChQuaternion<double>::Normalize((ChQuaternion<double> *)&local_580);
  chrono::ChMatrix33<double>::Set_A_quaternion(local_340,(ChQuaternion<double> *)&local_580);
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       5.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       6.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       7.0;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)local_580.m_data;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)local_580.m_rows;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (double)local_580.m_cols;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dStack_568;
  chrono::ChTransform<double>::TransformLocalToParent
            ((ChVector<double> *)&local_460,(ChVector<double> *)local_520,local_340);
  chrono::ChTransform<double>::TransformLocalToParent
            ((ChVector<double> *)&local_460,(ChVector<double> *)local_520,
             (ChQuaternion<double> *)&local_580);
  chrono::ChCoordsys<double>::TransformLocalToParent
            (local_1a0,(ChCoordsys<double> *)&local_400,(ChVector<double> *)&local_460);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1] * local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar4 = vfmadd231sd_fma(auVar27,auVar23,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1] * local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar5 = vfmadd231sd_fma(auVar31,auVar23,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1] * local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar6 = vfmadd231sd_fma(auVar25,auVar23,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar4 = vfmadd231sd_fma(auVar4,auVar29,auVar7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar5 = vfmadd231sd_fma(auVar5,auVar29,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar6 = vfmadd231sd_fma(auVar6,auVar29,auVar3);
  local_f0[0].m_data[0] = auVar4._0_8_ + (double)local_520[0].m_data;
  local_f0[0].m_data[1] = auVar5._0_8_ + (double)local_520[0].m_rows;
  local_f0[0].m_data[2] = auVar6._0_8_ + (double)local_520[0].m_cols;
  chrono::ChVector<double>::Equals(local_200,(ChVector<double> *)local_4c0,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(true);
  poVar14 = std::operator<<(poVar14," ");
  chrono::ChVector<double>::Equals(local_1a0,(ChVector<double> *)local_4c0,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  poVar14 = std::operator<<(poVar14," ");
  chrono::ChVector<double>::Equals(local_f0,(ChVector<double> *)local_4c0,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  std::endl<char,std::char_traits<char>>(poVar14);
  chrono::ChTransform<double>::TransformParentToLocal
            ((ChVector<double> *)local_4c0,(ChVector<double> *)local_520,
             (ChQuaternion<double> *)&local_580);
  chrono::ChTransform<double>::TransformParentToLocal
            ((ChVector<double> *)local_4c0,(ChVector<double> *)local_520,local_340);
  chrono::ChCoordsys<double>::TransformParentToLocal
            (&local_108,(ChCoordsys<double> *)&local_400,(ChVector<double> *)local_4c0);
  auVar9._8_8_ = local_4c0[0].m_rows;
  auVar9._0_8_ = local_4c0[0].m_data;
  local_90 = vsubpd_avx(auVar9,local_520[0]._0_16_);
  local_80 = (double)local_4c0[0].m_cols - (double)local_520[0].m_cols;
  local_130.m_matrix = (non_const_type)local_340;
  chrono::operator*(&local_130,(ChVector<double> *)local_90);
  chrono::ChVector<double>::Equals
            ((ChVector<double> *)&local_360,(ChVector<double> *)&local_460,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(true);
  poVar14 = std::operator<<(poVar14," ");
  chrono::ChVector<double>::Equals
            ((ChVector<double> *)&local_128,(ChVector<double> *)&local_460,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  poVar14 = std::operator<<(poVar14," ");
  chrono::ChVector<double>::Equals(&local_108,(ChVector<double> *)&local_460,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  poVar14 = std::operator<<(poVar14," ");
  chrono::ChVector<double>::Equals(&local_a8,(ChVector<double> *)&local_460,1e-06);
  poVar14 = std::ostream::_M_insert<bool>(SUB81(poVar14,0));
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"\n=== Linear systems ===\n");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_400;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_400.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       2.0;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_340,
                       (Scalar *)&local_460);
  local_520[0].m_data = (double *)0x4008000000000000;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,(Scalar *)local_520);
  local_4c0[0].m_data = (double *)0x4010000000000000;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,(Scalar *)local_4c0);
  local_200[0].m_data[0] = 5.0;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,local_200[0].m_data);
  local_1a0[0].m_data[0] = 6.0;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,local_1a0[0].m_data);
  local_f0[0].m_data[0] = 7.0;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,local_f0[0].m_data);
  local_360.m_data[0] = 8.0;
  pCVar19 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar19,local_360.m_data);
  local_128.m_data[0] = 10.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
            (pCVar19,local_128.m_data);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_340);
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_580.m_data = (double *)0x4008000000000000;
  local_460.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       3.0;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_580;
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_340,
                    (Scalar *)&local_460);
  local_520[0].m_data = (double *)0x4010000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (this,(Scalar *)local_520);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_340);
  poVar14 = std::operator<<((ostream *)&std::cout,"matrix A:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_400
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"vector b:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_580
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>::
  ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>
            ((ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>> *)local_340,
             (EigenBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_400);
  local_520[0]._0_16_ =
       (undefined1  [16])
       Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>>::
       solve<Eigen::Matrix<double,3,1,0,3,1>>
                 ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>> *)
                  local_340,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_580);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_460,
             (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_520);
  poVar14 = std::operator<<((ostream *)&std::cout,"solution:\n");
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_460
                             );
  std::endl<char,std::char_traits<char>>(poVar14);
  poVar14 = std::operator<<((ostream *)&std::cout,"Ax-b:\n");
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_460;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_580;
  local_340[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_400;
  poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)local_340);
  std::endl<char,std::char_traits<char>>(poVar14);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    ///! [Basic operations with matrices]
    std::cout << "\n=== Creation and assignment ===\n" << std::endl;
    {
        // Matrix allocated on the heap.
        chrono::ChMatrixDynamic<> Md1(5, 7);
        chrono::ChMatrixDynamic<> Md2(4, 4);

        // Matrix allocated on the stack.
        chrono::ChMatrixNM<double, 4, 4> Ms;

        // 3x3 matrices, mostly used for coordinate transformations.
        chrono::ChMatrix33<> ma;

        Ms.setConstant(0.1);  // Fill a matrix with an element
        std::cout << Ms << std::endl;

        Md1.setRandom();         // initialize with random numbers
        Md1.transposeInPlace();  // transpose the matrix in place
        Md1.resize(2, 2);        // resize
        Md1.setZero();           // set all elements to zero

        Md2.setIdentity();  // Create a diagonal matrix
        Md2 *= 3;

        Md2(0, 0) = 10;  // Use the () operator to reference single elements
        Md2(1, 2) = Md2(0, 0) + Md2(1, 1);
        Md2(2, 2) = 4;

        chrono::ChMatrixDynamic<> M1(Md2);   // Copy constructor
        chrono::ChMatrixDynamic<> M2(-Ms);   // The - unary operator returns a negated matrix
        chrono::ChMatrixDynamic<> M3(8, 4);  // 8x4 uninitialized matrix
        M3 = M1;                             // Copy (resize as needed)
        M3 = M1.transpose();                 // transposed copy.
    }

    std::cout << "\n=== Matrix operations ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        chrono::ChMatrixDynamic<double> B(2, 3);
        A.setRandom();
        B.setRandom();
        chrono::ChMatrixDynamic<> result(A + B);
        result = A + B;
        result = A;
        result += B;

        // Different ways to do subtraction..
        result = A - B;
        result = A;
        result -= B;

        // Multiplication with scalar
        result = A * 10;
        result = 10 * A;
        std::cout << result << std::endl;

        result = A;
        result *= 10;
        std::cout << result << std::endl;

        // Matrix multiplications
        chrono::ChMatrixDynamic<> C(3, 2);
        chrono::ChMatrixDynamic<> D(2, 3);
        chrono::ChMatrixDynamic<double> CD = C * D;
        chrono::ChMatrixDynamic<double> CD_t = D.transpose() * C.transpose();

        chrono::ChMatrix33<> R(chrono::Q_from_AngX(chrono::CH_C_PI / 3));
        std::cout << "rot * matrix\n" << R * C << std::endl;
        std::cout << "matrix * rot\n" << D * R << std::endl;
    }

    std::cout << "\n=== Chrono extensions to Eigen::MatrixBase ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        std::cout << "random 2x3 matrix A:\n" << A << std::endl;
        A.fillDiagonal(10.1);
        std::cout << "fill diagonal with 10.1:\n" << A << std::endl;
        A.fill(2.1);
        std::cout << "fill entire matrix with 2.1:\n" << A << std::endl;

        chrono::ChMatrixNM<double, 2, 3> B(A);
        B(1, 2) += 0.01;
        std::cout << "matrix B = A with B(1,2) incremented by 0.01\n" << B << std::endl;
        std::cout << "|A-B| < 0.1?   " << A.equals(B, 0.1) << std::endl;
        std::cout << "|A-B| < 0.001? " << A.equals(B, 0.001) << std::endl;

        chrono::ChVectorDynamic<> v(3);
        v << 2, 3, 4;
        chrono::ChVectorDynamic<> w(3);
        w << 0.1, 0.2, 0.3;
        std::cout << "||v||_wrms, w = " << v.wrmsNorm(w) << std::endl;
        std::cout << "||v + v||_wrms, w = " << (v + v).wrmsNorm(w) << std::endl;

        std::cout << "v + v + 1: " << (v + v) + 1 << std::endl;
        std::cout << "1 + v: " << 1 + v << std::endl;
    }

    std::cout << "\n=== Matrix comparison tests ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        chrono::ChMatrixDynamic<> B(A);
        if (A == B) {
            std::cout << "Matrices are exactly equal" << std::endl;
        }

        // Tolerance comparison
        B(1, 2) += 0.001;
        if (A.equals(B, 0.002)) {
            std::cout << "Matrices are equal within tol 0.002 \n";
        }
    }

    std::cout << "\n=== Pasting matrices and matrix-blocks ===\n" << std::endl;
    {
        chrono::ChMatrixDynamic<> A(4, 6);
        A.setRandom();
        std::cout << A << "\n\n";

        chrono::ChMatrixNM<double, 2, 3> B;
        B << 1, 2, 3, 4, 5, 6;
        std::cout << B << "\n\n";

        chrono::ChMatrixNM<double, 5, 7> C;
        C.setZero();
        C.block<2, 3>(1, 1) << 10, 20, 30, 40, 50, 60;
        std::cout << C << "\n\n";

        chrono::ChMatrixDynamic<> X = A;
        X.block<2, 3>(1, 2) = B;
        std::cout << X << "\n\n";

        X.block<2, 3>(1, 2) += C.block<2, 3>(1, 1);
        std::cout << X << "\n\n";
    }

    std::cout << "\n=== 3x3 matrix times vector ===\n" << std::endl;
    {
        chrono::ChVector<> v(1, 2, 3);
        chrono::ChMatrix33<> A;
        A.setRandom();

        chrono::ChMatrix33<> B(1);
        std::cout << B << std::endl;

        // Vector transformation, typical product [A] * v
        chrono::ChVector<> res1 = A * v;

        // Inverse vector transformation, [A]' * v
        chrono::ChVector<> res2 = A.transpose() * v;

        std::cout << A << std::endl;
        std::cout << res1 << std::endl;
        std::cout << res2 << std::endl;
    }

    std::cout << "\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n" << std::endl;
    {
        chrono::ChMatrix34<> G = Eigen::Matrix<double, 3, 4>::Ones(3, 4);
        chrono::ChQuaternion<> q(1, 2, 3, 4);
        chrono::ChVector<> v = G * q;
        std::cout << v << std::endl;

        chrono::ChMatrix43<> Gt = 2 * G.transpose();
        std::cout << Gt << std::endl;
        q = Gt * v;
        std::cout << q << std::endl;
        q = G.transpose() * v;
        std::cout << q << std::endl;

        chrono::ChMatrix33<> rot(chrono::Q_from_AngX(chrono::CH_C_PI / 6));
        std::cout << rot << std::endl;
        std::cout << rot.transpose() << std::endl;

        chrono::ChMatrix34<> res1 = rot * G;
        chrono::ChMatrix34<> res2 = rot * Gt.transpose();
        chrono::ChMatrix43<> res3 = Gt * rot;
        chrono::ChMatrix43<> res4 = G.transpose() * rot;
        std::cout << "rot * G:\n" << res1 << std::endl;
        std::cout << "rot * (G').transpose:\n" << res2 << std::endl;
        std::cout << "G' * rot:\n" << res3 << std::endl;
        std::cout << "G.transpose * rot:\n" << res4 << std::endl;

        chrono::ChMatrix44<> A44;
        A44.setRandom();
        chrono::ChQuaternion<> q2 = A44 * q;
        std::cout << "Random 4x4 * q:\n" << q2 << std::endl; 

        chrono::ChStarMatrix44<> X(chrono::ChQuaternion<>(1, 2, 3, 4));
        std::cout << "4x4 star matrix X:\n" << X << std::endl;
        X.semiTranspose();
        std::cout << "Semi-transpose X:\n" << X << std::endl;
        X.semiNegate();
        std::cout << "Semi-negate X:\n" << X << std::endl;
    }

    std::cout << "\n=== Use of ChTransform ===\n" << std::endl;
    {
        chrono::ChVector<> vl(2, 3, 4);        // local point to transform
        chrono::ChVector<> t(5, 6, 7);         // translation of coord system
        chrono::ChQuaternion<> q(1, 3, 4, 5);  // rotation of coord system (quaternion)
        q.Normalize();                         // as unit quaternion, must be normalized
        chrono::ChMatrix33<> R;                // rotation of coord system (rotation matrix)
        R.Set_A_quaternion(q);                 // set from quaternion
        chrono::Coordsys csys(t, q);           // coordinate system representing translation + rotation

        // Perform the transformation: v = t + [R] * v'
        // NOTE: all the following ways will give the same result, so you can use them equivalently!
        auto va1 = chrono::ChTransform<>::TransformLocalToParent(vl, t, R);
        auto va2 = chrono::ChTransform<>::TransformLocalToParent(vl, t, q);
        auto va3 = csys.TransformLocalToParent(vl);
        auto va4 = t + R * vl;
        std::cout << va2.Equals(va1, 1e-6) << " " << va3.Equals(va1, 1e-6) << " " << va4.Equals(va1, 1e-6) << std::endl;

        // Inverse transformation
        auto vl1 = chrono::ChTransform<>::TransformParentToLocal(va1, t, q);
        auto vl2 = chrono::ChTransform<>::TransformParentToLocal(va1, t, R);
        auto vl3 = csys.TransformParentToLocal(va1);
        auto vl4 = R.transpose() * (va1 - t);
        std::cout << vl1.Equals(vl, 1e-6) << " " << vl2.Equals(vl, 1e-6) << " " << vl3.Equals(vl, 1e-6) << " "
                  << vl4.Equals(vl, 1e-6) << std::endl;
    }

    std::cout << "\n=== Linear systems ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 3, 3> A;
        Eigen::Vector3d b;
        A << 1, 2, 3, 4, 5, 6, 7, 8, 10;
        b << 3, 3, 4;
        std::cout << "matrix A:\n" << A << std::endl;
        std::cout << "vector b:\n" << b << std::endl;
        Eigen::Vector3d x = A.colPivHouseholderQr().solve(b);
        std::cout << "solution:\n" << x << std::endl;
        std::cout << "Ax-b:\n" << A * x - b << std::endl;
    }
    ///! [Basic operations with matrices]

    return 0;
}